

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void __thiscall llvm::Triple::setObjectFormat(Triple *this,ObjectFormatType Kind)

{
  Child CVar1;
  Child CVar2;
  NodeKind LHSKind;
  Child CVar3;
  Child CVar4;
  StringRef SVar5;
  Child local_e8 [2];
  undefined2 local_d8;
  undefined6 uStack_d6;
  Twine local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  NodeKind local_98;
  char cStack_97;
  undefined6 uStack_96;
  uint local_90;
  undefined4 uStack_8c;
  NodeKind local_80;
  char cStack_7f;
  undefined6 uStack_7e;
  uint local_78;
  undefined4 uStack_74;
  NodeKind local_68;
  char cStack_67;
  undefined6 uStack_66;
  string local_60;
  StringRef local_40;
  StringRef local_30;
  
  if (this->Environment != UnknownEnvironment) {
    local_30 = getEnvironmentTypeName(this->Environment);
    Twine::Twine((Twine *)&local_78,&local_30);
    Twine::Twine((Twine *)&local_90,"-");
    if ((local_68 == NullKind) || (local_80 == NullKind)) {
      local_d8 = 0x100;
    }
    else if (local_68 == EmptyKind) {
      local_d8._1_1_ = cStack_7f;
      local_d8._0_1_ = local_80;
      uStack_d6 = uStack_7e;
      local_e8[0]._0_4_ = local_90;
      local_e8[0]._4_4_ = uStack_8c;
    }
    else if (local_80 == EmptyKind) {
      local_d8._1_1_ = cStack_67;
      local_d8._0_1_ = local_68;
      uStack_d6 = uStack_66;
      local_e8[0]._0_4_ = local_78;
      local_e8[0]._4_4_ = uStack_74;
    }
    else {
      CVar3._4_4_ = uStack_74;
      CVar3.decUI = local_78;
      if (cStack_67 != '\x01') {
        local_68 = TwineKind;
        CVar3.twine = (Twine *)&local_78;
      }
      if (cStack_7f != '\x01') {
        local_80 = TwineKind;
      }
      CVar2._4_4_ = uStack_8c;
      CVar2.decUI = local_90;
      CVar4.twine = (Twine *)&local_90;
      if (cStack_7f == '\x01') {
        CVar4 = CVar2;
      }
      Twine::Twine((Twine *)local_e8,CVar3,local_68,CVar4,local_80);
    }
    local_40 = getObjectFormatTypeName(Kind);
    Twine::Twine((Twine *)&local_a8,&local_40);
    if (((NodeKind)local_d8 == NullKind) || (local_98 == NullKind)) {
      local_c8._16_2_ = 0x100;
    }
    else if ((NodeKind)local_d8 == EmptyKind) {
      local_c8.RHSKind = cStack_97;
      local_c8.LHSKind = local_98;
      local_c8._18_6_ = uStack_96;
    }
    else if (local_98 == EmptyKind) {
      local_c8.LHSKind = (NodeKind)local_d8;
      local_c8.RHSKind = local_d8._1_1_;
      local_c8._18_6_ = uStack_d6;
    }
    else {
      CVar4._4_4_ = local_e8[0]._4_4_;
      CVar4.decUI = local_e8[0].decUI;
      LHSKind = (NodeKind)local_d8;
      if (local_d8._1_1_ != EmptyKind) {
        CVar4.twine = (Twine *)local_e8;
        LHSKind = TwineKind;
      }
      if (cStack_97 != '\x01') {
        local_98 = TwineKind;
      }
      CVar1._4_4_ = uStack_a4;
      CVar1.decUI = local_a8;
      CVar3.twine = (Twine *)&local_a8;
      if (cStack_97 == '\x01') {
        CVar3 = CVar1;
      }
      Twine::Twine(&local_c8,CVar4,LHSKind,CVar3,local_98);
    }
    Twine::str_abi_cxx11_(&local_60,&local_c8);
    SVar5.Length = local_60._M_string_length;
    SVar5.Data = local_60._M_dataplus._M_p;
    setEnvironmentName(this,SVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  SVar5 = getObjectFormatTypeName(Kind);
  setEnvironmentName(this,SVar5);
  return;
}

Assistant:

void Triple::setObjectFormat(ObjectFormatType Kind) {
  if (Environment == UnknownEnvironment)
    return setEnvironmentName(getObjectFormatTypeName(Kind));

  setEnvironmentName((getEnvironmentTypeName(Environment) + Twine("-") +
                      getObjectFormatTypeName(Kind)).str());
}